

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O1

Matrix * Matrix::multiply(Matrix *m1,Matrix *m2)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  Matrix *pMVar4;
  double *pdVar5;
  size_t sVar6;
  double *pdVar7;
  long lVar8;
  size_t sVar9;
  long lVar10;
  size_t sVar11;
  double dVar12;
  
  sVar1 = m1->rows;
  sVar2 = m2->cols;
  if (sVar1 == sVar2) {
    pMVar4 = (Matrix *)operator_new(0x18);
    pMVar4->rows = sVar1;
    pMVar4->cols = sVar2;
    pdVar5 = ArrayHelper::getArray(sVar1,sVar2,false);
    pMVar4->data = pdVar5;
    sVar1 = pMVar4->rows;
    if (sVar1 != 0) {
      sVar2 = pMVar4->cols;
      lVar8 = 0;
      sVar9 = 0;
      do {
        if (sVar2 != 0) {
          sVar3 = m1->cols;
          lVar10 = 0;
          sVar11 = 0;
          do {
            if (sVar3 == 0) {
              dVar12 = 0.0;
            }
            else {
              pdVar7 = (double *)((long)m2->data + lVar10);
              dVar12 = 0.0;
              sVar6 = 0;
              do {
                dVar12 = dVar12 + *(double *)((long)m1->data + sVar6 * 8 + sVar3 * lVar8) * *pdVar7;
                sVar6 = sVar6 + 1;
                pdVar7 = pdVar7 + m2->cols;
              } while (sVar3 != sVar6);
            }
            pdVar5[sVar2 * sVar9 + sVar11] = dVar12;
            sVar11 = sVar11 + 1;
            lVar10 = lVar10 + 8;
          } while (sVar11 != sVar2);
        }
        sVar9 = sVar9 + 1;
        lVar8 = lVar8 + 8;
      } while (sVar9 != sVar1);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Parameter 1 ROWS don\'t match Parameter 2 COLS",0x2d);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
    std::ostream::put('x');
    std::ostream::flush();
    pMVar4 = (Matrix *)0x0;
  }
  return pMVar4;
}

Assistant:

Matrix* Matrix::multiply(Matrix* m1, Matrix* m2) {
	if (m1->rows != m2->cols) {
		std::cout << "Parameter 1 ROWS don't match Parameter 2 COLS" << std::endl;
		return nullptr;
	}

	Matrix* matrix = new Matrix(m1->rows, m2->cols);
	for (size_t i = 0; i < matrix->rows; i++) {
		for (size_t j = 0; j < matrix->cols; j++) {
			double sum = 0;
			for (size_t k = 0; k < m1->cols; k++) {
				sum += m1->data[i * m1->cols + k] * m2->data[k * m2->cols + j];
			}
			matrix->data[i * matrix->cols + j] = sum;
		}
	}
	return matrix;
}